

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O3

ctmbstr prvTidygetNextInstalledLanguage(TidyIterator *iter)

{
  ctmbstr ptVar1;
  TidyIterator p_Var2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]libtidy/src/language.c"
                  ,0x284,"ctmbstr prvTidygetNextInstalledLanguage(TidyIterator *)");
  }
  p_Var2 = *iter;
  p_Var3 = (TidyIterator)(ulong)tidyInstalledLanguageListSize_array_size;
  if (p_Var2 == (TidyIterator)0x0) {
    ptVar1 = (ctmbstr)0x0;
    p_Var2 = (TidyIterator)0x0;
  }
  else {
    if (tidyInstalledLanguageListSize_array_size == 0) {
      if (PTR_language_en_001cd210 == (undefined *)0x0) {
        p_Var3 = (TidyIterator)0x0;
      }
      else {
        p_Var3 = (TidyIterator)0x0;
        do {
          tidyInstalledLanguageListSize_array_size = (int)p_Var3 + 1;
          p_Var3 = (TidyIterator)(ulong)tidyInstalledLanguageListSize_array_size;
        } while ((&PTR_language_en_001cd210)[(long)p_Var3] != (undefined *)0x0);
      }
    }
    if (p_Var3 < p_Var2) {
      ptVar1 = (ctmbstr)0x0;
    }
    else {
      ptVar1 = (&tidyLanguages.fallbackLanguage)[(long)p_Var2]->messages[0].value;
      p_Var2 = (TidyIterator)((long)&p_Var2->_opaque + 1);
    }
  }
  if ((int)p_Var3 == 0) {
    if (PTR_language_en_001cd210 == (undefined *)0x0) {
      p_Var3 = (TidyIterator)0x0;
    }
    else {
      p_Var3 = (TidyIterator)0x0;
      do {
        tidyInstalledLanguageListSize_array_size = (int)p_Var3 + 1;
        p_Var3 = (TidyIterator)(ulong)tidyInstalledLanguageListSize_array_size;
      } while ((&PTR_language_en_001cd210)[(long)p_Var3] != (undefined *)0x0);
    }
  }
  p_Var4 = (TidyIterator)0x0;
  if (p_Var2 <= p_Var3) {
    p_Var4 = p_Var2;
  }
  *iter = p_Var4;
  return ptVar1;
}

Assistant:

ctmbstr TY_(getNextInstalledLanguage)( TidyIterator* iter )
{
    ctmbstr item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyInstalledLanguageListSize() )
    {
        item = tidyLanguages.languages[itemIndex - 1]->messages[0].value;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyInstalledLanguageListSize() ? itemIndex : (size_t)0 );
    return item;
}